

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

int Curl_cpool_check_limits(Curl_easy *data,connectdata *conn)

{
  Curl_share *pCVar1;
  Curl_multi *pCVar2;
  char *pcVar3;
  curl_off_t cVar4;
  curl_trc_feat *pcVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  _Bool _Var8;
  size_t sVar9;
  Curl_llist *list;
  size_t sVar10;
  ulong uVar11;
  Curl_llist_node *n;
  connectdata *pcVar12;
  timediff_t tVar13;
  size_t sVar14;
  ulong uVar15;
  connectdata *pcVar16;
  ulong uVar17;
  cpool *cpool;
  long lVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  curltime cVar22;
  curltime newer;
  curltime older;
  size_t local_68;
  
  if (data == (Curl_easy *)0x0) {
    cpool = (cpool *)0x0;
  }
  else {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      if (data->multi_easy == (Curl_multi *)0x0) {
        cpool = &data->multi->cpool;
        if (data->multi == (Curl_multi *)0x0) {
          cpool = (cpool *)0x0;
        }
      }
      else {
        cpool = &data->multi_easy->cpool;
      }
    }
    else {
      cpool = &pCVar1->cpool;
    }
  }
  if (cpool == (cpool *)0x0) {
    return 0;
  }
  pCVar2 = cpool->idata->multi;
  if (pCVar2 == (Curl_multi *)0x0) {
    uVar15 = 0;
    uVar17 = 0;
  }
  else {
    uVar15 = pCVar2->max_host_connections;
    uVar17 = pCVar2->max_total_connections;
  }
  if (uVar15 == 0 && uVar17 == 0) {
    return 0;
  }
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  cpool->field_0x68 = cpool->field_0x68 | 1;
  if (uVar15 == 0) {
    uVar19 = 0;
  }
  else {
    pcVar3 = conn->destination;
    sVar9 = strlen(pcVar3);
    list = (Curl_llist *)Curl_hash_pick(&cpool->dest2bundle,pcVar3,sVar9 + 1);
    if (list == (Curl_llist *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = Curl_llist_count(list);
    }
    sVar10 = Curl_cshutdn_dest_count(data,conn->destination);
    uVar11 = sVar10 + local_68;
    while (uVar15 <= uVar11) {
      if (sVar10 == 0) {
        if (list == (Curl_llist *)0x0) break;
        cVar22 = Curl_now();
        n = Curl_llist_head(list);
        if (n == (Curl_llist_node *)0x0) {
          pcVar16 = (connectdata *)0x0;
        }
        else {
          lVar18 = -1;
          pcVar16 = (connectdata *)0x0;
          do {
            pcVar12 = (connectdata *)Curl_node_elem(n);
            _Var8 = Curl_uint_spbset_empty(&pcVar12->xfers_attached);
            if ((_Var8) &&
               (uVar6 = (pcVar12->lastused).tv_sec, uVar7 = (pcVar12->lastused).tv_usec,
               older.tv_usec = uVar7, older.tv_sec = uVar6, newer._12_4_ = 0,
               newer.tv_sec = SUB128(cVar22._0_12_,0), newer.tv_usec = SUB124(cVar22._0_12_,8),
               older._12_4_ = 0, tVar13 = Curl_timediff(newer,older), lVar18 < tVar13)) {
              lVar18 = tVar13;
              pcVar16 = pcVar12;
            }
            n = Curl_node_next(n);
          } while (n != (Curl_llist_node *)0x0);
        }
        if (pcVar16 != (connectdata *)0x0) {
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
              ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
               (0 < pcVar5->log_level)))) && (0 < Curl_trc_feat_multi.log_level)) {
            cVar4 = pcVar16->connection_id;
            sVar14 = Curl_llist_count(list);
            Curl_trc_multi(data,
                           "Discarding connection #%ld from %zu to reach destination limit of %zu",
                           cVar4,sVar14,uVar15);
          }
          Curl_conn_terminate(cpool->idata,pcVar16,false);
          pcVar3 = conn->destination;
          sVar9 = strlen(pcVar3);
          list = (Curl_llist *)Curl_hash_pick(&cpool->dest2bundle,pcVar3,sVar9 + 1);
          if (list == (Curl_llist *)0x0) {
            local_68 = 0;
          }
          else {
            local_68 = Curl_llist_count(list);
          }
        }
        if (pcVar16 == (connectdata *)0x0) break;
      }
      else {
        _Var8 = Curl_cshutdn_close_oldest(data,conn->destination);
        if (!_Var8) break;
      }
      sVar10 = Curl_cshutdn_dest_count(cpool->idata,conn->destination);
      uVar11 = sVar10 + local_68;
    }
    bVar21 = uVar15 <= sVar10 + local_68;
    uVar19 = (uint)bVar21;
    uVar20 = (uint)bVar21;
    if (bVar21) goto LAB_0011a85f;
  }
  uVar20 = uVar19;
  if (uVar17 != 0) {
    sVar10 = Curl_cshutdn_count(cpool->idata);
    uVar15 = sVar10 + cpool->num_conn;
    while (uVar17 <= uVar15) {
      if (sVar10 == 0) {
        pcVar16 = cpool_get_oldest_idle(cpool);
        if (pcVar16 == (connectdata *)0x0) break;
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           (((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)
             ) && (0 < Curl_trc_feat_multi.log_level)))) {
          Curl_trc_multi(data,"Discarding connection #%ld from %zu to reach total limit of %zu",
                         pcVar16->connection_id,cpool->num_conn,uVar17);
        }
        Curl_conn_terminate(cpool->idata,pcVar16,false);
        if (pcVar16 == (connectdata *)0x0) break;
      }
      else {
        _Var8 = Curl_cshutdn_close_oldest(data,(char *)0x0);
        if (!_Var8) break;
      }
      sVar10 = Curl_cshutdn_count(cpool->idata);
      uVar15 = sVar10 + cpool->num_conn;
    }
    uVar20 = 2;
    if (sVar10 + cpool->num_conn < uVar17) {
      uVar20 = uVar19;
    }
  }
LAB_0011a85f:
  cpool->field_0x68 = cpool->field_0x68 & 0xfe;
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  return uVar20;
}

Assistant:

int Curl_cpool_check_limits(struct Curl_easy *data,
                            struct connectdata *conn)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  size_t dest_limit = 0;
  size_t total_limit = 0;
  size_t shutdowns;
  int result = CPOOL_LIMIT_OK;

  if(!cpool)
    return CPOOL_LIMIT_OK;

  if(cpool->idata->multi) {
    dest_limit = cpool->idata->multi->max_host_connections;
    total_limit = cpool->idata->multi->max_total_connections;
  }

  if(!dest_limit && !total_limit)
    return CPOOL_LIMIT_OK;

  CPOOL_LOCK(cpool, cpool->idata);
  if(dest_limit) {
    size_t live;

    bundle = cpool_find_bundle(cpool, conn);
    live = bundle ? Curl_llist_count(&bundle->conns) : 0;
    shutdowns = Curl_cshutdn_dest_count(data, conn->destination);
    while((live  + shutdowns) >= dest_limit) {
      if(shutdowns) {
        /* close one connection in shutdown right away, if we can */
        if(!Curl_cshutdn_close_oldest(data, conn->destination))
          break;
      }
      else if(!bundle)
        break;
      else {
        struct connectdata *oldest_idle = NULL;
        /* The bundle is full. Extract the oldest connection that may
         * be removed now, if there is one. */
        oldest_idle = cpool_bundle_get_oldest_idle(bundle);
        if(!oldest_idle)
          break;
        /* disconnect the old conn and continue */
        CURL_TRC_M(data, "Discarding connection #%"
                     FMT_OFF_T " from %zu to reach destination "
                     "limit of %zu", oldest_idle->connection_id,
                     Curl_llist_count(&bundle->conns), dest_limit);
        Curl_conn_terminate(cpool->idata, oldest_idle, FALSE);

        /* in case the bundle was destroyed in disconnect, look it up again */
        bundle = cpool_find_bundle(cpool, conn);
        live = bundle ? Curl_llist_count(&bundle->conns) : 0;
      }
      shutdowns = Curl_cshutdn_dest_count(cpool->idata, conn->destination);
    }
    if((live + shutdowns) >= dest_limit) {
      result = CPOOL_LIMIT_DEST;
      goto out;
    }
  }

  if(total_limit) {
    shutdowns = Curl_cshutdn_count(cpool->idata);
    while((cpool->num_conn + shutdowns) >= total_limit) {
      if(shutdowns) {
        /* close one connection in shutdown right away, if we can */
        if(!Curl_cshutdn_close_oldest(data, NULL))
          break;
      }
      else {
        struct connectdata *oldest_idle = cpool_get_oldest_idle(cpool);
        if(!oldest_idle)
          break;
        /* disconnect the old conn and continue */
        CURL_TRC_M(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach total "
                   "limit of %zu",
                   oldest_idle->connection_id, cpool->num_conn, total_limit);
        Curl_conn_terminate(cpool->idata, oldest_idle, FALSE);
      }
      shutdowns = Curl_cshutdn_count(cpool->idata);
    }
    if((cpool->num_conn + shutdowns) >= total_limit) {
      result = CPOOL_LIMIT_TOTAL;
      goto out;
    }
  }

out:
  CPOOL_UNLOCK(cpool, cpool->idata);
  return result;
}